

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

string * clask::camelize(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong local_28;
  size_t i;
  size_type n;
  string *s_local;
  
  uVar2 = std::__cxx11::string::length();
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    if (((local_28 == 0) ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == ' ')) ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == '-')) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar1 = toupper((int)*pcVar3);
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)s);
      *puVar4 = (char)iVar1;
    }
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  return __return_storage_ptr__;
}

Assistant:

inline std::string camelize(std::string& s) {
  auto n = s.length();
  for (size_t i = 0; i < n; i++) {
    if (i == 0 || s[i - 1] == ' ' || s[i - 1] == '-') {
      s[i] = (char) std::toupper(s[i]);
      continue;
    }
  }
  return s.substr(0, n);
}